

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int gen_publickey_from_ec_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,int is_sk,EVP_PKEY *pk)

{
  bool bVar1;
  uchar *puVar2;
  int iVar3;
  uchar *str;
  uchar *puVar4;
  size_t __n;
  char *pcVar5;
  int iVar6;
  uchar *p;
  size_t octal_len;
  uchar *local_68;
  size_t local_60;
  uchar **local_58;
  uchar **local_50;
  size_t *local_48;
  size_t *local_40;
  size_t local_38;
  
  local_68 = (uchar *)((ulong)local_68 & 0xffffffff00000000);
  local_50 = method;
  local_48 = method_len;
  local_40 = pubkeydata_len;
  EVP_PKEY_get_int_param(pk,"bits",&local_68);
  iVar3 = 0x19f;
  if ((int)local_68 == 0x180) {
    iVar3 = 0x2cb;
  }
  iVar6 = 0x2cc;
  if ((int)local_68 != 0x209) {
    iVar6 = iVar3;
  }
  __n = 0x22;
  if (is_sk == 0) {
    __n = 0x13;
  }
  str = (uchar *)(*session->alloc)(__n,&session->abstract);
  if (str == (uchar *)0x0) {
    iVar3 = _libssh2_error(session,-6,"out of memory");
    return iVar3;
  }
  local_58 = pubkeydata;
  if (is_sk == 0) {
    if (iVar6 == 0x2cc) {
      pcVar5 = "ecdsa-sha2-nistp521";
    }
    else if (iVar6 == 0x2cb) {
      pcVar5 = "ecdsa-sha2-nistp384";
    }
    else {
      if (iVar6 != 0x19f) {
        bVar1 = false;
        pcVar5 = (char *)0x0;
        goto LAB_001117b2;
      }
      pcVar5 = "ecdsa-sha2-nistp256";
    }
  }
  else {
    pcVar5 = "sk-ecdsa-sha2-nistp256@openssh.com";
  }
  memcpy(str,pcVar5,__n);
  local_38 = 0x85;
  pcVar5 = (char *)(*session->alloc)(0x85,&session->abstract);
  EVP_PKEY_get_octet_string_param(pk,"pub",pcVar5,local_38,&local_38);
  local_60 = local_38 + __n + 0x14;
  puVar4 = (uchar *)(*session->alloc)(local_60,&session->abstract);
  if (puVar4 == (uchar *)0x0) {
    bVar1 = false;
  }
  else {
    local_68 = puVar4;
    _libssh2_store_str(&local_68,(char *)str,__n);
    puVar2 = (uchar *)"ecdsa-sha2-nistp256";
    if (is_sk == 0) {
      puVar2 = str;
    }
    _libssh2_store_str(&local_68,(char *)(puVar2 + 0xb),8);
    _libssh2_store_str(&local_68,pcVar5,local_38);
    *local_50 = str;
    if (local_48 != (size_t *)0x0) {
      *local_48 = __n;
    }
    *local_58 = puVar4;
    bVar1 = true;
    if (local_40 != (size_t *)0x0) {
      *local_40 = local_60;
    }
  }
LAB_001117b2:
  if (pcVar5 != (char *)0x0) {
    free(pcVar5);
  }
  iVar3 = 0;
  if (!bVar1) {
    (*session->free)(str,&session->abstract);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int
gen_publickey_from_ec_evp(LIBSSH2_SESSION *session,
                          unsigned char **method,
                          size_t *method_len,
                          unsigned char **pubkeydata,
                          size_t *pubkeydata_len,
                          int is_sk,
                          EVP_PKEY *pk)
{
    int rc = 0;
    unsigned char *p;
    unsigned char *method_buf = NULL;
    unsigned char *key;
    size_t  method_buf_len = 0;
    size_t  key_len = 0;
    unsigned char *octal_value = NULL;
    size_t octal_len;
    libssh2_curve_type type;

#ifdef USE_OPENSSL_3
    _libssh2_debug((session,
       LIBSSH2_TRACE_AUTH,
       "Computing public key from EC private key envelope"));

    type = _libssh2_ecdsa_get_curve_type(pk);
#else
    EC_KEY *ec = NULL;
    const EC_POINT *public_key;
    const EC_GROUP *group;
    BN_CTX *bn_ctx = NULL;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing public key from EC private key envelope"));

    bn_ctx = BN_CTX_new();
    if(!bn_ctx)
        return -1;

    ec = EVP_PKEY_get1_EC_KEY(pk);
    if(!ec) {
        rc = -1;
        goto clean_exit;
    }

    public_key = EC_KEY_get0_public_key(ec);
    group = EC_KEY_get0_group(ec);
    type = _libssh2_ecdsa_get_curve_type(ec);
#endif

    if(is_sk)
        method_buf_len = 34;
    else
        method_buf_len = 19;

    method_buf = LIBSSH2_ALLOC(session, method_buf_len);
    if(!method_buf) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "out of memory");
    }

    if(is_sk) {
        memcpy(method_buf, "sk-ecdsa-sha2-nistp256@openssh.com",
               method_buf_len);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP256) {
        memcpy(method_buf, "ecdsa-sha2-nistp256", method_buf_len);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP384) {
        memcpy(method_buf, "ecdsa-sha2-nistp384", method_buf_len);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP521) {
        memcpy(method_buf, "ecdsa-sha2-nistp521", method_buf_len);
    }
    else {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_ERROR,
                       "Unsupported EC private key type"));
        rc = -1;
        goto clean_exit;
    }

#ifdef USE_OPENSSL_3
    octal_len = EC_MAX_POINT_LEN;
    octal_value = LIBSSH2_ALLOC(session, octal_len);
    EVP_PKEY_get_octet_string_param(pk, OSSL_PKEY_PARAM_PUB_KEY,
                                    octal_value, octal_len, &octal_len);
#else
    /* get length */
    octal_len = EC_POINT_point2oct(group, public_key,
                                   POINT_CONVERSION_UNCOMPRESSED,
                                   NULL, 0, bn_ctx);
    if(octal_len > EC_MAX_POINT_LEN) {
        rc = -1;
        goto clean_exit;
    }

    octal_value = malloc(octal_len);
    if(!octal_value) {
        rc = -1;
        goto clean_exit;
    }

    /* convert to octal */
    if(EC_POINT_point2oct(group, public_key, POINT_CONVERSION_UNCOMPRESSED,
       octal_value, octal_len, bn_ctx) != octal_len) {
        rc = -1;
        goto clean_exit;
    }
#endif

    /* Key form is: type_len(4) + type(method_buf_len) + domain_len(4)
       + domain(8) + pub_key_len(4) + pub_key(~65). */
    key_len = 4 + method_buf_len + 4 + 8 + 4 + octal_len;
    key = LIBSSH2_ALLOC(session, key_len);
    if(!key) {
        rc = -1;
        goto clean_exit;
    }

    /* Process key encoding. */
    p = key;

    /* Key type */
    _libssh2_store_str(&p, (const char *)method_buf, method_buf_len);

    /* Name domain */
    if(is_sk) {
        _libssh2_store_str(&p, "nistp256", 8);
    }
    else {
        _libssh2_store_str(&p, (const char *)method_buf + 11, 8);
    }

    /* Public key */
    _libssh2_store_str(&p, (const char *)octal_value, octal_len);

    *method = method_buf;
    if(method_len) {
        *method_len = method_buf_len;
    }
    *pubkeydata = key;
    if(pubkeydata_len) {
        *pubkeydata_len = key_len;
    }

clean_exit:

#ifndef USE_OPENSSL_3
    if(ec)
        EC_KEY_free(ec);

    if(bn_ctx) {
        BN_CTX_free(bn_ctx);
    }
#endif

    if(octal_value)
        free(octal_value);

    if(rc == 0)
        return 0;

    if(method_buf)
        LIBSSH2_FREE(session, method_buf);

    return -1;
}